

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateFromSelect(Parse *pParse,int iEph,Index *pPk,ExprList *pChanges,SrcList *pTabList,
                     Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u32 *puVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  short sVar4;
  sqlite3 *db;
  Table *pTVar5;
  SrcList *pSrc;
  Expr *pWhere_00;
  Expr *pEVar6;
  ExprList *pList;
  Select *p;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ExprList_item *pEVar10;
  byte local_81;
  SelectDest dest;
  
  db = pParse->db;
  pTVar5 = pTabList->a[0].pTab;
  pSrc = sqlite3SrcListDup(db,pTabList,0);
  if (pWhere == (Expr *)0x0) {
    pWhere_00 = (Expr *)0x0;
  }
  else {
    pWhere_00 = exprDup(db,pWhere,0,(u8 **)0x0);
  }
  if (pSrc != (SrcList *)0x0) {
    puVar2 = &pSrc->a[0].fg.field_0x2;
    *puVar2 = *puVar2 | 2;
    pSrc->a[0].iCursor = -1;
    puVar1 = &(pSrc->a[0].pTab)->nTabRef;
    *puVar1 = *puVar1 - 1;
    pSrc->a[0].pTab = (Table *)0x0;
  }
  if (pPk == (Index *)0x0) {
    if (pTVar5->eTabType == '\x02') {
      local_81 = 0xe;
      iVar7 = 0;
      if (pTVar5->nCol < 1) {
        pList = (ExprList *)0x0;
      }
      else {
        pList = (ExprList *)0x0;
        do {
          pEVar6 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
          if (pEVar6 != (Expr *)0x0) {
            pEVar6->iColumn = (short)iVar7 + 1;
          }
          pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
          iVar7 = iVar7 + 1;
        } while (iVar7 < pTVar5->nCol);
      }
    }
    else {
      local_81 = pTVar5->eTabType == '\x01' ^ 0xf;
      pEVar6 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
      pList = sqlite3ExprListAppendNew(pParse->db,pEVar6);
    }
  }
  else {
    if (pPk->nKeyCol == 0) {
      pList = (ExprList *)0x0;
    }
    else {
      uVar8 = 0;
      pList = (ExprList *)0x0;
      do {
        sVar4 = pPk->aiColumn[uVar8];
        pEVar6 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
        if (pEVar6 != (Expr *)0x0) {
          pEVar6->iColumn = sVar4 + 1;
        }
        pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
        uVar8 = uVar8 + 1;
      } while (uVar8 < pPk->nKeyCol);
    }
    local_81 = pTVar5->eTabType == '\x01' ^ 0xf;
  }
  if ((pChanges != (ExprList *)0x0) && (0 < pChanges->nExpr)) {
    pEVar10 = pChanges->a;
    lVar9 = 0;
    do {
      if (pEVar10->pExpr == (Expr *)0x0) {
        pEVar6 = (Expr *)0x0;
      }
      else {
        pEVar6 = exprDup(db,pEVar10->pExpr,0,(u8 **)0x0);
      }
      pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
      lVar9 = lVar9 + 1;
      pEVar10 = pEVar10 + 1;
    } while (lVar9 < pChanges->nExpr);
  }
  p = sqlite3SelectNew(pParse,pList,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                       0x820000,(Expr *)0x0);
  if (p != (Select *)0x0) {
    pbVar3 = (byte *)((long)&p->selFlags + 3);
    *pbVar3 = *pbVar3 | 8;
  }
  dest.eDest = local_81;
  dest.zAffSdst = (char *)0x0;
  dest.iSdst = 0;
  dest.nSdst = 0;
  if (pPk == (Index *)0x0) {
    dest.iSDParm2 = 0xffffffff;
  }
  else {
    dest.iSDParm2 = (int)pPk->nKeyCol;
  }
  dest.iSDParm = iEph;
  sqlite3Select(pParse,p,&dest);
  if (p == (Select *)0x0) {
    return;
  }
  clearSelect(db,p,1);
  return;
}

Assistant:

static void updateFromSelect(
  Parse *pParse,                  /* Parse context */
  int iEph,                       /* Cursor for open eph. table */
  Index *pPk,                     /* PK if table 0 is WITHOUT ROWID */
  ExprList *pChanges,             /* List of expressions to return */
  SrcList *pTabList,              /* List of tables to select from */
  Expr *pWhere,                   /* WHERE clause for query */
  ExprList *pOrderBy,             /* ORDER BY clause */
  Expr *pLimit                    /* LIMIT clause */
){
  int i;
  SelectDest dest;
  Select *pSelect = 0;
  ExprList *pList = 0;
  ExprList *pGrp = 0;
  Expr *pLimit2 = 0;
  ExprList *pOrderBy2 = 0;
  sqlite3 *db = pParse->db;
  Table *pTab = pTabList->a[0].pTab;
  SrcList *pSrc;
  Expr *pWhere2;
  int eDest;

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( pOrderBy && pLimit==0 ) {
    sqlite3ErrorMsg(pParse, "ORDER BY without LIMIT on UPDATE");
    return;
  }
  pOrderBy2 = sqlite3ExprListDup(db, pOrderBy, 0);
  pLimit2 = sqlite3ExprDup(db, pLimit, 0);
#else
  UNUSED_PARAMETER(pOrderBy);
  UNUSED_PARAMETER(pLimit);
#endif

  pSrc = sqlite3SrcListDup(db, pTabList, 0);
  pWhere2 = sqlite3ExprDup(db, pWhere, 0);

  assert( pTabList->nSrc>1 );
  if( pSrc ){
    pSrc->a[0].fg.notCte = 1;
    pSrc->a[0].iCursor = -1;
    pSrc->a[0].pTab->nTabRef--;
    pSrc->a[0].pTab = 0;
  }
  if( pPk ){
    for(i=0; i<pPk->nKeyCol; i++){
      Expr *pNew = exprRowColumn(pParse, pPk->aiColumn[i]);
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
      if( pLimit ){
        pGrp = sqlite3ExprListAppend(pParse, pGrp, sqlite3ExprDup(db, pNew, 0));
      }
#endif
      pList = sqlite3ExprListAppend(pParse, pList, pNew);
    }
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
  }else if( IsView(pTab) ){
    for(i=0; i<pTab->nCol; i++){
      pList = sqlite3ExprListAppend(pParse, pList, exprRowColumn(pParse, i));
    }
    eDest = SRT_Table;
  }else{
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
    pList = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
    if( pLimit ){
      pGrp = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
    }
#endif
  }
  assert( pChanges!=0 || pParse->db->mallocFailed );
  if( pChanges ){
    for(i=0; i<pChanges->nExpr; i++){
      pList = sqlite3ExprListAppend(pParse, pList,
          sqlite3ExprDup(db, pChanges->a[i].pExpr, 0)
      );
    }
  }
  pSelect = sqlite3SelectNew(pParse, pList,
      pSrc, pWhere2, pGrp, 0, pOrderBy2, SF_UFSrcCheck|SF_IncludeHidden, pLimit2
  );
  if( pSelect ) pSelect->selFlags |= SF_OrderByReqd;
  sqlite3SelectDestInit(&dest, eDest, iEph);
  dest.iSDParm2 = (pPk ? pPk->nKeyCol : -1);
  sqlite3Select(pParse, pSelect, &dest);
  sqlite3SelectDelete(db, pSelect);
}